

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttribType *type,int arraySize
          )

{
  int iVar1;
  int local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar1 = (int)type;
  local_64 = iVar1;
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"",(allocator<char> *)&local_40);
  }
  else {
    de::toString<int>(&local_40,&local_64);
    std::operator+(&local_60,"_array_",&local_40);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_60
                );
  std::__cxx11::string::~string((string *)&local_60);
  if (iVar1 != -1) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string generateTestName (const AttribType& type, int arraySize)
{
	return type.getName() + (arraySize != Attribute::NOT_ARRAY ? "_array_" + de::toString(arraySize) : "");
}